

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionControlElement::IfcDistributionControlElement
          (IfcDistributionControlElement *this)

{
  *(undefined ***)&this->field_0x180 = &PTR__Object_00806870;
  *(undefined8 *)&this->field_0x188 = 0;
  *(char **)&this->field_0x190 = "IfcDistributionControlElement";
  IfcDistributionElement::IfcDistributionElement
            ((IfcDistributionElement *)this,&PTR_construction_vtable_24__00875c18);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
  aux_is_derived.super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x875ae8;
  *(undefined8 *)&this->field_0x180 = 0x875c00;
  *(undefined8 *)&this->field_0x88 = 0x875b10;
  *(undefined8 *)&this->field_0x98 = 0x875b38;
  *(undefined8 *)&this->field_0xd0 = 0x875b60;
  *(undefined8 *)&this->field_0x100 = 0x875b88;
  *(undefined8 *)&this->field_0x138 = 0x875bb0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
  _vptr_ObjectHelper = (_func_int **)0x875bd8;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
    field_0x10 = &(this->
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
                  field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
    field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).field_0x20
       = 0;
  this->field_0x178 = 0;
  return;
}

Assistant:

IfcDistributionControlElement() : Object("IfcDistributionControlElement") {}